

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O1

void __thiscall QPDF::importJSON(QPDF *this,shared_ptr<InputSource> *is,bool must_be_complete)

{
  int iVar1;
  runtime_error *this_00;
  undefined4 extraout_var;
  JSONReactor reactor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_118;
  shared_ptr<InputSource> local_f8 [3];
  undefined1 local_c8 [72];
  char local_80;
  
  local_f8[0].super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (is->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_f8[0].super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (is->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_f8[0].super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_f8[0].super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_f8[0].super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_f8[0].super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_f8[0].super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  JSONReactor::JSONReactor((JSONReactor *)(local_c8 + 0x10),this,local_f8,must_be_complete);
  if (local_f8[0].super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8[0].super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  JSON::parse((InputSource *)local_c8,
              (Reactor *)(is->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
  }
  if (local_80 == '\0') {
    JSONReactor::~JSONReactor((JSONReactor *)(local_c8 + 0x10));
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  iVar1 = (*((is->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_InputSource[3])();
  std::operator+(&bStack_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar1),": errors found in JSON");
  std::runtime_error::runtime_error(this_00,(string *)&bStack_118);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QPDF::importJSON(std::shared_ptr<InputSource> is, bool must_be_complete)
{
    JSONReactor reactor(*this, is, must_be_complete);
    try {
        JSON::parse(*is, &reactor);
    } catch (std::runtime_error& e) {
        throw std::runtime_error(is->getName() + ": " + e.what());
    }
    if (reactor.anyErrors()) {
        throw std::runtime_error(is->getName() + ": errors found in JSON");
    }
}